

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

ParseResult *
tinyusdz::prim::anon_unknown_0::ParseExtentAttribute
          (ParseResult *__return_storage_ptr__,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *table,string *prop_name,Property *prop,string *name,
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *target)

{
  pointer pPVar1;
  vtable_type *pvVar2;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  Property *pPVar6;
  int iVar7;
  uint32_t uVar8;
  const_iterator cVar9;
  undefined8 uVar10;
  undefined1 uVar11;
  undefined7 uVar12;
  long lVar13;
  TimeSamples *pTVar14;
  pointer pPVar15;
  ulong uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  string *this;
  undefined1 uVar18;
  ResultCode RVar19;
  PrimVar *this_00;
  char cVar20;
  bool bVar21;
  optional<tinyusdz::Animatable<tinyusdz::Extent>_> av;
  string attr_type_name;
  optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_> local_108
  ;
  undefined1 uStack_e8;
  undefined6 uStack_e7;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *local_e0;
  TimeSamples *local_d8;
  Property *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  string *local_c0;
  undefined8 local_b8;
  undefined1 auStack_b0 [26];
  undefined6 uStack_96;
  undefined1 uStack_90;
  undefined7 uStack_8f;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined1 local_80;
  undefined7 uStack_7f;
  bool local_78;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_70;
  string *local_68;
  long local_60;
  long local_58;
  string local_50;
  
  paVar17 = &(__return_storage_ptr__->err).field_2;
  (__return_storage_ptr__->err)._M_dataplus._M_p = (pointer)paVar17;
  (__return_storage_ptr__->err)._M_string_length = 0;
  (__return_storage_ptr__->err).field_2._M_local_buf[0] = '\0';
  iVar7 = ::std::__cxx11::string::compare((string *)prop_name);
  if (iVar7 != 0) goto LAB_001fd621;
  cVar9 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)table,name);
  if ((_Rb_tree_header *)cVar9._M_node != &(table->_M_t)._M_impl.super__Rb_tree_header) {
    __return_storage_ptr__->code = AlreadyProcessed;
    return __return_storage_ptr__;
  }
  this = (string *)&__return_storage_ptr__->err;
  local_e0 = target;
  Attribute::type_name_abi_cxx11_(&local_50,&prop->_attrib);
  if (prop->_type == Attrib) {
    pPVar1 = (prop->_attrib)._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar15 = (prop->_attrib)._paths.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_c8 = paVar17;
    local_70 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)table;
    if (pPVar15 != pPVar1) {
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_e0->_paths,
                 &(prop->_attrib)._paths);
    }
    local_d0 = prop;
    if ((prop->_attrib)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (prop->_attrib)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar2 = (prop->_attrib)._var._value.v_.vtable;
      if (pvVar2 == (vtable_type *)0x0) {
        bVar21 = false;
      }
      else {
        uVar8 = (*pvVar2->type_id)();
        bVar21 = uVar8 == 4;
      }
      if ((bVar21) || (((local_d0->_attrib)._var._blocked & 1U) != 0)) {
        local_e0->_blocked = true;
      }
    }
    pPVar6 = local_d0;
    local_68 = name;
    if (((local_d0->_attrib)._var._blocked == false) &&
       ((((pvVar2 = (local_d0->_attrib)._var._value.v_.vtable, pvVar2 != (vtable_type *)0x0 &&
          (uVar8 = (*pvVar2->type_id)(), uVar8 == 0)) ||
         ((pvVar2 = (pPVar6->_attrib)._var._value.v_.vtable, pvVar2 != (vtable_type *)0x0 &&
          (uVar8 = (*pvVar2->type_id)(), uVar8 == 1)))) &&
        ((pPVar6->_attrib)._var._ts._samples.
         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish ==
         (pPVar6->_attrib)._var._ts._samples.
         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start)))) {
      RVar19 = Success;
      if (pPVar15 != pPVar1) {
        AttrMetas::operator=(&local_e0->_metas,&(local_d0->_attrib)._metas);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(local_70,local_68);
        paVar17 = local_c8;
        goto LAB_001fdc00;
      }
      bVar21 = true;
      bVar5 = false;
      paVar17 = local_c8;
    }
    else {
      this_00 = &(pPVar6->_attrib)._var;
      local_b8 = 0x7f8000007f800000;
      auStack_b0._0_2_ = 0;
      auStack_b0._2_6_ = 0xff8000007f80;
      auStack_b0._8_2_ = 0;
      auStack_b0._10_6_ = 0xff800000ff80;
      auStack_b0._16_2_ = 0;
      auStack_b0[0x18] = false;
      auStack_b0[0x19] = false;
      uStack_96 = 0;
      uStack_90 = 0;
      uStack_8f = 0;
      local_88 = 0;
      uStack_87 = 0;
      local_80 = 0;
      bVar21 = primvar::PrimVar::is_valid(this_00);
      if (bVar21) {
        bVar21 = true;
        if ((pPVar6->_attrib)._var._blocked == false) {
          pvVar2 = (pPVar6->_attrib)._var._value.v_.vtable;
          if ((pvVar2 == (vtable_type *)0x0) || (uVar8 = (*pvVar2->type_id)(), uVar8 != 0)) {
            pvVar2 = (local_d0->_attrib)._var._value.v_.vtable;
            if (pvVar2 != (vtable_type *)0x0) {
              uVar8 = (*pvVar2->type_id)();
              bVar21 = uVar8 != 1;
            }
          }
          else {
            bVar21 = false;
          }
        }
        if (bVar21) {
          pTVar14 = (TimeSamples *)this_00;
          primvar::PrimVar::
          get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                    (&local_108,this_00);
          bVar5 = local_108.has_value_;
          if (local_108.has_value_ == true) {
            this_00 = (PrimVar *)CONCAT44(local_108.contained._4_4_,local_108.contained._0_4_);
            pPVar15 = (pointer)CONCAT44(local_108.contained._12_4_,local_108.contained._8_4_);
            pTVar14 = (TimeSamples *)
                      CONCAT17(local_108.contained._23_1_,
                               CONCAT61(local_108.contained._17_6_,local_108.contained._16_1_));
            local_108.contained._0_4_ = 0;
            local_108.contained._4_4_ = 0;
            local_108.contained._8_4_ = 0;
            local_108.contained._12_4_ = 0;
            local_108.contained._16_1_ = 0;
            local_108.contained._17_6_ = 0;
            local_108.contained._23_1_ = 0;
          }
          if (local_108.has_value_ == false) {
LAB_001fd8d1:
            if ((bVar5 & this_00 != (PrimVar *)0x0) == 1) {
              operator_delete(this_00,(long)pTVar14 - (long)this_00);
            }
            goto LAB_001fd8eb;
          }
          pvVar3 = (void *)CONCAT44(local_108.contained._4_4_,local_108.contained._0_4_);
          if (pvVar3 != (void *)0x0) {
            local_d8 = pTVar14;
            operator_delete(pvVar3,CONCAT17(local_108.contained._23_1_,
                                            CONCAT61(local_108.contained._17_6_,
                                                     local_108.contained._16_1_)) - (long)pvVar3);
            pTVar14 = local_d8;
          }
          if ((long)pPVar15 - (long)this_00 == 0x18) {
            local_b8 = *(undefined8 *)&(this_00->_value).v_.storage;
            uVar10 = *(undefined8 *)((long)&(this_00->_value).v_.storage + 8);
            pvVar2 = (this_00->_value).v_.vtable;
            auStack_b0._0_2_ = (undefined2)uVar10;
            auStack_b0._2_6_ = (undefined6)((ulong)uVar10 >> 0x10);
            auStack_b0._8_2_ = SUB82(pvVar2,0);
            auStack_b0._10_6_ = (undefined6)((ulong)pvVar2 >> 0x10);
            auStack_b0._16_2_ = 1;
            goto LAB_001fd8d1;
          }
          local_108.contained._16_1_ = 0;
          local_108.contained._17_6_ = 0;
          local_108.contained._23_1_ = 0;
          uStack_e8 = 0;
          uStack_e7 = 0;
          local_108._7_1_ = 0;
          local_108.contained._0_4_ = 0;
          local_108.contained._4_4_ = 0;
          local_108.contained._8_4_ = 0;
          local_108.contained._12_4_ = 0;
          if (this_00 != (PrimVar *)0x0) {
            operator_delete(this_00,(long)pTVar14 - (long)this_00);
          }
          goto LAB_001fdad5;
        }
LAB_001fd8eb:
        if ((local_d0->_attrib)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (local_d0->_attrib)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (!bVar21) goto LAB_001fdac8;
        }
        else {
          local_d8 = &(local_d0->_attrib)._var._ts;
          lVar13 = 0;
          uVar16 = 0;
          local_c0 = this;
          do {
            if ((local_d0->_attrib)._var._ts._dirty == true) {
              tinyusdz::value::TimeSamples::update(local_d8);
            }
            pvVar3 = (((any *)&(local_d8->_samples).
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      )->storage).dynamic;
            if (*(char *)((long)pvVar3 + lVar13 + 0x20) != '\x01') {
              tinyusdz::value::Value::
              get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                        (&local_108,(Value *)((long)pvVar3 + lVar13 + 8),false);
              bVar21 = local_108.has_value_;
              if (local_108.has_value_ == true) {
                this_00 = (PrimVar *)CONCAT44(local_108.contained._4_4_,local_108.contained._0_4_);
                local_58 = CONCAT44(local_108.contained._12_4_,local_108.contained._8_4_);
                local_60 = CONCAT17(local_108.contained._23_1_,
                                    CONCAT61(local_108.contained._17_6_,local_108.contained._16_1_))
                ;
                local_108.contained._0_4_ = 0;
                local_108.contained._4_4_ = 0;
                local_108.contained._8_4_ = 0;
                local_108.contained._12_4_ = 0;
                local_108.contained._16_1_ = 0;
                local_108.contained._17_6_ = 0;
                local_108.contained._23_1_ = 0;
              }
              if (local_108.has_value_ != false) {
                pvVar4 = (void *)CONCAT44(local_108.contained._4_4_,local_108.contained._0_4_);
                if (pvVar4 != (void *)0x0) {
                  operator_delete(pvVar4,CONCAT17(local_108.contained._23_1_,
                                                  CONCAT61(local_108.contained._17_6_,
                                                           local_108.contained._16_1_)) -
                                         (long)pvVar4);
                }
                if (local_58 - (long)this_00 == 0x18) {
                  local_108.contained._0_4_ =
                       *(undefined4 *)((long)&(this_00->_value).v_.storage + 8);
                  uVar10 = *(undefined8 *)&(this_00->_value).v_.storage;
                  local_108.has_value_ = SUB81(uVar10,0);
                  local_108._1_6_ = SUB86((ulong)uVar10 >> 8,0);
                  local_108._7_1_ = SUB81((ulong)uVar10 >> 0x38,0);
                  local_108.contained._12_4_ =
                       *(undefined4 *)((long)&(this_00->_value).v_.vtable + 4);
                  uVar10 = *(undefined8 *)((long)&(this_00->_value).v_.storage + 0xc);
                  local_108.contained._4_4_ = (undefined4)uVar10;
                  local_108.contained._8_4_ = (undefined4)((ulong)uVar10 >> 0x20);
                  TypedTimeSamples<tinyusdz::Extent>::add_sample
                            ((TypedTimeSamples<tinyusdz::Extent> *)(auStack_b0 + 0x18),
                             *(double *)((long)pvVar3 + lVar13),(Extent *)&local_108);
                  this = local_c0;
                  if (this_00 != (PrimVar *)0x0) {
                    operator_delete(this_00,local_60 - (long)this_00);
                    this = local_c0;
                  }
                  goto LAB_001fda4c;
                }
              }
              local_108.contained._16_1_ = 0;
              local_108.contained._17_6_ = 0;
              local_108.contained._23_1_ = 0;
              uStack_e8 = 0;
              uStack_e7 = 0;
              local_108._7_1_ = 0;
              local_108.contained._0_4_ = 0;
              local_108.contained._4_4_ = 0;
              local_108.contained._8_4_ = 0;
              local_108.contained._12_4_ = 0;
              if ((bVar21 & this_00 != (PrimVar *)0x0) == 1) {
                operator_delete(this_00,local_60 - (long)this_00);
              }
              uVar10 = 0;
              uVar11 = 0;
              uVar12 = 0;
              pTVar14 = (TimeSamples *)0x0;
              uVar18 = 0;
              cVar20 = '\0';
              this = local_c0;
              goto LAB_001fdae1;
            }
            TypedTimeSamples<tinyusdz::Extent>::add_blocked_sample
                      ((TypedTimeSamples<tinyusdz::Extent> *)(auStack_b0 + 0x18),
                       *(double *)((long)pvVar3 + lVar13));
LAB_001fda4c:
            uVar16 = uVar16 + 1;
            lVar13 = lVar13 + 0x28;
          } while (uVar16 < (ulong)(((long)(local_d0->_attrib)._var._ts._samples.
                                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(local_d0->_attrib)._var._ts._samples.
                                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x3333333333333333));
        }
        uVar12 = uStack_8f;
        uVar11 = uStack_90;
        local_108.contained._16_1_ = SUB21(auStack_b0._8_2_,1);
        local_108.contained._17_6_ = auStack_b0._10_6_;
        local_108.contained._23_1_ = (undefined1)auStack_b0._16_2_;
        uStack_e8 = SUB21(auStack_b0._16_2_,1);
        local_108._7_1_ = SUB81(local_b8,0);
        local_108.contained._0_4_ = (undefined4)((ulong)local_b8 >> 8);
        local_108.contained._4_3_ = (undefined3)((ulong)local_b8 >> 0x28);
        local_108.contained._7_1_ = (undefined1)auStack_b0._0_2_;
        local_108.contained._8_4_ = (undefined4)(CONCAT62(auStack_b0._2_6_,auStack_b0._0_2_) >> 8);
        local_108.contained._15_1_ = (undefined1)auStack_b0._8_2_;
        local_108.contained._12_3_ = SUB63(auStack_b0._2_6_,3);
        uVar10 = CONCAT62(uStack_96,auStack_b0._24_2_);
        pTVar14 = (TimeSamples *)CONCAT71(uStack_87,local_88);
        auStack_b0[0x18] = false;
        auStack_b0[0x19] = false;
        uStack_96 = 0;
        uStack_90 = 0;
        uStack_8f = 0;
        local_88 = 0;
        uStack_87 = 0;
        cVar20 = '\x01';
        uVar18 = local_80;
      }
      else {
LAB_001fdac8:
        local_108.contained._16_1_ = 0;
        local_108.contained._17_6_ = 0;
        local_108.contained._23_1_ = 0;
        uStack_e8 = 0;
        uStack_e7 = 0;
        local_108._7_1_ = 0;
        local_108.contained._0_4_ = 0;
        local_108.contained._4_4_ = 0;
        local_108.contained._8_4_ = 0;
        local_108.contained._12_4_ = 0;
LAB_001fdad5:
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        pTVar14 = (TimeSamples *)0x0;
        uVar18 = 0;
        cVar20 = '\0';
      }
LAB_001fdae1:
      pvVar3 = (void *)CONCAT62(uStack_96,auStack_b0._24_2_);
      if (pvVar3 != (void *)0x0) {
        local_d8 = pTVar14;
        operator_delete(pvVar3,CONCAT71(uStack_87,local_88) - (long)pvVar3);
        pTVar14 = local_d8;
      }
      paVar17 = local_c8;
      local_b8 = CONCAT71(local_b8._1_7_,cVar20);
      if (cVar20 != '\0') {
        auStack_b0._16_2_ =
             (undefined2)(CONCAT14(local_108.contained._16_1_,local_108.contained._12_4_) >> 0x18);
        auStack_b0._18_6_ = local_108.contained._17_6_;
        auStack_b0._24_2_ =
             (undefined2)
             (CONCAT17(uStack_e8,CONCAT16(local_108.contained._23_1_,local_108.contained._17_6_)) >>
             0x30);
        auStack_b0._0_2_ = (undefined2)CONCAT41(local_108.contained._0_4_,local_108._7_1_);
        auStack_b0._2_6_ =
             (undefined6)
             (CONCAT35(local_108.contained._4_3_,CONCAT41(local_108.contained._0_4_,local_108._7_1_)
                      ) >> 0x10);
        auStack_b0._8_2_ = (undefined2)CONCAT41(local_108.contained._8_4_,local_108.contained._7_1_)
        ;
        auStack_b0._10_6_ =
             (undefined6)
             (CONCAT35(local_108.contained._12_3_,
                       CONCAT41(local_108.contained._8_4_,local_108.contained._7_1_)) >> 0x10);
        uStack_90 = (undefined1)uVar10;
        uStack_8f = (undefined7)((ulong)uVar10 >> 8);
        local_80 = SUB81(pTVar14,0);
        uStack_7f = (undefined7)((ulong)pTVar14 >> 8);
        local_88 = uVar11;
        uStack_87 = uVar12;
        local_78 = (bool)uVar18;
      }
      if (cVar20 == '\x01') {
        nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>>::operator=
                  ((optional<tinyusdz::Animatable<tinyusdz::Extent>> *)&local_e0->_attrib,
                   (Animatable<tinyusdz::Extent> *)auStack_b0);
      }
      else {
        __return_storage_ptr__->code = InternalError;
        ::std::__cxx11::string::operator=
                  (this,
                   "Converting Attribute data failed. Maybe TimeSamples have values with different types?"
                  );
      }
      if (((char)local_b8 == '\x01') &&
         (pvVar3 = (void *)CONCAT71(uStack_8f,uStack_90), pvVar3 != (void *)0x0)) {
        operator_delete(pvVar3,CONCAT71(uStack_7f,local_80) - (long)pvVar3);
      }
      bVar21 = false;
      RVar19 = Success;
      if (cVar20 != '\0') {
        AttrMetas::operator=(&local_e0->_metas,&(local_d0->_attrib)._metas);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(local_70,local_68);
        goto LAB_001fdc00;
      }
      bVar5 = true;
    }
  }
  else {
    if (prop->_type == EmptyAttrib) {
      local_e0->_value_empty = true;
      AttrMetas::operator=(&local_e0->_metas,&(prop->_attrib)._metas);
      ::std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)table,name);
      RVar19 = Success;
    }
    else {
      ::std::__cxx11::string::_M_replace
                ((ulong)this,0,(char *)(__return_storage_ptr__->err)._M_string_length,0x601f00);
      RVar19 = InternalError;
    }
LAB_001fdc00:
    __return_storage_ptr__->code = RVar19;
    bVar5 = true;
    bVar21 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (!bVar21) {
    if (bVar5) {
      return __return_storage_ptr__;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(long **)this == paVar17) {
      return __return_storage_ptr__;
    }
    operator_delete(*(long **)this,paVar17->_M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
LAB_001fd621:
  __return_storage_ptr__->code = Unmatched;
  return __return_storage_ptr__;
}

Assistant:

static ParseResult ParseExtentAttribute(std::set<std::string> &table, /* inout */
  const std::string prop_name,
  const Property &prop,
  const std::string &name,
  TypedAttribute<Animatable<Extent>> &target) /* out */
{
  ParseResult ret;

#if 0
  if (prop_name.compare(name + ".connect") == 0) {
    std::string propname = removeSuffix(name, ".connect");
    if (table.count(propname)) {
      DCOUT("Already processed: " << prop_name);
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }
    if (prop.is_connection()) {
      const Attribute &attr = prop.get_attribute();
      if (attr.is_connection()) {
        target.set_connections(attr.connections());
        //target.variability = prop.attrib.variability;
        target.metas() = prop.get_attribute().metas();
        table.insert(propname);
        ret.code = ParseResult::ResultCode::Success;
        DCOUT("Added as property with connection: " << propname);
        return ret;
      } else {
        ret.code = ParseResult::ResultCode::InvalidConnection;
        ret.err = "Connection target not found.";
        return ret;
      }
    } else {
      ret.code = ParseResult::ResultCode::InternalError;
      ret.err = "Internal error. Unsupported/Unimplemented property type.";
      return ret;
    }
#endif
  if (prop_name.compare(name) == 0) {
    if (table.count(name)) {
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }

    const Attribute &attr = prop.get_attribute();

    std::string attr_type_name = attr.type_name();
    if (prop.get_property_type() == Property::Type::EmptyAttrib) {
      DCOUT("Added prop with empty value: " << name);
      target.set_value_empty();
      target.metas() = attr.metas();
      table.insert(name);
      ret.code = ParseResult::ResultCode::Success;
      return ret;
    } else if (prop.get_property_type() == Property::Type::Attrib) {

      //bool has_default{false};
      bool has_connections{false};

      if (attr.has_connections()) {
        target.set_connections(attr.connections());
        //target.variability = prop.attrib.variability;
        //target.metas() = prop.get_attribute().metas();
        //table.insert(prop_name);
        //ret.code = ParseResult::ResultCode::Success;
        //return ret;
        has_connections = true;
      }

      DCOUT("Adding typed extent attribute: " << name);

      if (attr.is_blocked()) {
        // e.g. "float3[] extent = None"
        target.set_blocked(true);
      }

#if 0
      } else {
        
        //
        // No variability check. allow `uniform extent`(promote to varying)
        //
        if (auto pv = attr.get_value<std::vector<value::float3>>()) {
          if (pv.value().size() != 2) {
            ret.code = ParseResult::ResultCode::TypeMismatch;
            ret.err = fmt::format("`extent` must be `float3[2]`, but got array size {}", pv.value().size());
            return ret;
          }

          Extent ext;
          ext.lower = pv.value()[0];
          ext.upper = pv.value()[1];

          //target.set_value(ext);
          animatable_value.set(ext);
        } else {
          ret.code = ParseResult::ResultCode::TypeMismatch;
          ret.err = fmt::format("`extent` must be `float3[]` type, but got `{}`", attr.type_name());
          return ret;
        }
      }

      if (attr.get_var().has_timesamples()) {
        // e.g. "float3[] extent.timeSamples = ..."

        if (auto av = ConvertToAnimatable<Extent>(attr.get_var())) {
          animatable_value.set(av.value().get_timesamples());
          //target.set_value(anim);
          
          has_timesamples = true;
        } else {
          // Conversion failed.
          DCOUT("ConvertToAnimatable failed.");
          ret.code = ParseResult::ResultCode::InternalError;
          ret.err = "Converting Attribute data failed. Maybe TimeSamples have values with different types or invalid array size?";
          return ret;
        }
      }

      if (has_default || has_timesamples) {
        DCOUT("Added Extent attribute: " << name);
        target.metas() = attr.metas();
        table.insert(name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;
      } else {
        DCOUT("Internal error.");
        ret.code = ParseResult::ResultCode::InternalError;
        ret.err = "Internal error. Invalid Attribute data";
        return ret;
      }
#else
      
      const auto &var = attr.get_var();

      if (var.has_default() || var.has_timesamples()) {
        if (auto av = ConvertToAnimatable<Extent>(var)) {
          target.set_value(av.value());
        } else {
          DCOUT("ConvertToAnimatable failed.");
          ret.code = ParseResult::ResultCode::InternalError;
          ret.err = "Converting Attribute data failed. Maybe TimeSamples have values with different types?";
          return ret;
        }

        DCOUT("Added typed extent attribute: " << name);

        target.metas() = attr.metas();
        table.insert(name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;
      }

      if (has_connections) {
        DCOUT("Added Extent connection attribute: " << name);
        target.metas() = attr.metas();
        table.insert(name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;
      }

#endif

    } else {
      DCOUT("Invalid Property.type");
      ret.err = "Invalid Property type(internal error)";
      ret.code = ParseResult::ResultCode::InternalError;
      return ret;
    }

  }

  ret.code = ParseResult::ResultCode::Unmatched;
  return ret;
}